

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_masking.h
# Opt level: O2

void cio_websocket_mask(uint8_t *buffer,size_t length,uint8_t *mask)

{
  uint uVar1;
  size_t i;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint_fast32_t aligned_mask;
  
  aligned_mask = 0;
  if (length < 8) {
    for (sVar2 = 0; length != sVar2; sVar2 = sVar2 + 1) {
      buffer[sVar2] = buffer[sVar2] ^ mask[(uint)sVar2 & 3];
    }
  }
  else {
    uVar1 = -(int)buffer & 7;
    uVar3 = length - uVar1;
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      *(uint8_t *)((long)&aligned_mask + lVar4) = mask[(int)lVar4 - (int)buffer & 3];
    }
    for (lVar4 = 0; uVar1 != (uint)lVar4; lVar4 = lVar4 + 1) {
      buffer[lVar4] = buffer[lVar4] ^ mask[(uint)lVar4 & 3];
    }
    for (uVar5 = 0; uVar3 >> 3 != uVar5; uVar5 = uVar5 + 1) {
      *(ulong *)(buffer + uVar5 * 8 + (ulong)uVar1) =
           *(ulong *)(buffer + uVar5 * 8 + (ulong)uVar1) ^ aligned_mask;
    }
    for (uVar3 = length - ((uint)uVar3 & 7); uVar3 < length; uVar3 = uVar3 + 1) {
      buffer[uVar3] = buffer[uVar3] ^ mask[(uint)uVar3 & 3];
    }
  }
  return;
}

Assistant:

static inline void cio_websocket_mask(uint8_t *buffer, size_t length, const uint8_t mask[4])
{
	uint_fast32_t aligned_mask = 0;

	if (length < sizeof(aligned_mask)) {
		for (size_t i = 0; i < length; i++) {
			buffer[i] = buffer[i] ^ (mask[i % 4]);
		}

		return;
	}

	unsigned int pre_length = ((uintptr_t)buffer) % sizeof(aligned_mask);
	pre_length = (sizeof(aligned_mask) - pre_length) % sizeof(aligned_mask);

	size_t main_length = (length - pre_length) / sizeof(aligned_mask);
	unsigned int post_length = (unsigned int)(length - pre_length - (main_length * sizeof(aligned_mask)));

	uint_fast32_t *buffer_aligned = (void *)(buffer + pre_length);

	uint8_t *aligned_mask_filler = (uint8_t *)&aligned_mask;
	for (uint_fast8_t i = 0; i < (uint_fast8_t)sizeof(aligned_mask); i++) {
		*aligned_mask_filler++ = mask[(i + pre_length) % 4];
	}

	unsigned int i_p = 0;
	while (pre_length-- > 0) {
		buffer[i_p] ^= (mask[i_p % 4]);
		i_p++;
	}

	while (main_length-- > 0) {
		*buffer_aligned ^= aligned_mask;
		buffer_aligned++;
	}

	for (size_t i = length - post_length; i < length; i++) {
		buffer[i] ^= (mask[i % 4]);
	}
}